

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O1

double __thiscall APathFollower::Splerp(APathFollower *this,double p1,double p2,double p3,double p4)

{
  double dVar1;
  
  dVar1 = (double)this->Time;
  return (dVar1 * dVar1 * dVar1 * (((p2 * 3.0 - p3 * 3.0) + p4) - p1) +
         ((p3 * 4.0 + p2 * -5.0 + p1 + p1) - p4) * dVar1 * dVar1 + (p3 - p1) * dVar1 + p2 + p2) *
         0.5;
}

Assistant:

double APathFollower::Splerp (double p1, double p2, double p3, double p4)
{
	double t = Time;
	double res = 2*p2;
	res += (p3 - p1) * Time;
	t *= Time;
	res += (2*p1 - 5*p2 + 4*p3 - p4) * t;
	t *= Time;
	res += (3*p2 - 3*p3 + p4 - p1) * t;
	return 0.5f * res;
}